

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_rerate(command *cmd)

{
  ulong uVar1;
  byte bVar2;
  player_upkeep *ppVar3;
  long lVar4;
  int iVar5;
  uint32_t uVar6;
  player *ppVar7;
  int iVar8;
  long lVar9;
  
  ppVar7 = player;
  iVar8 = (ushort)player->hitdie - 1;
  player->player_hp[0] = (ushort)player->hitdie;
  lVar4 = 1;
  lVar9 = lVar4;
  do {
    for (; lVar9 != 0x32; lVar9 = lVar9 + 1) {
      uVar6 = Rand_div((uint)ppVar7->hitdie);
      ppVar7 = player;
      player->player_hp[lVar9] = (short)uVar6 + player->player_hp[lVar9 + -1] + 1;
    }
    iVar5 = (int)ppVar7->player_hp[0x31];
    lVar9 = lVar4;
  } while ((iVar5 < (iVar8 * 0x96) / 8 + 0x32) || ((iVar8 * 0xfa) / 8 + 0x32 < iVar5));
  bVar2 = ppVar7->hitdie;
  ppVar3 = ppVar7->upkeep;
  uVar1._0_4_ = ppVar3->update;
  uVar1._4_4_ = ppVar3->redraw;
  ppVar3->update = (int)(uVar1 | 0x4000000004);
  ppVar3->redraw = (int)((uVar1 | 0x4000000004) >> 0x20);
  msg("Current Life Rating is %d/100.",
      (long)(iVar5 * 200) / (long)(int)((uint)bVar2 * 0x32) & 0xffffffff);
  return;
}

Assistant:

void do_cmd_wiz_rerate(struct command *cmd)
{
	int min_value, max_value, percent;

	min_value = (PY_MAX_LEVEL * 3 * (player->hitdie - 1)) / 8;
	min_value += PY_MAX_LEVEL;

	max_value = (PY_MAX_LEVEL * 5 * (player->hitdie - 1)) / 8;
	max_value += PY_MAX_LEVEL;

	player->player_hp[0] = player->hitdie;

	/* Rerate */
	while (1) {
		int i;

		/* Collect values */
		for (i = 1; i < PY_MAX_LEVEL; i++) {
			player->player_hp[i] = randint1(player->hitdie);
			player->player_hp[i] += player->player_hp[i - 1];
		}

		/* Legal values */
		if (player->player_hp[PY_MAX_LEVEL - 1] >= min_value &&
			player->player_hp[PY_MAX_LEVEL - 1] <= max_value) break;
	}

	percent = (int)(((long)player->player_hp[PY_MAX_LEVEL - 1] * 200L) /
		(player->hitdie + ((PY_MAX_LEVEL - 1) * player->hitdie)));

	/* Update and redraw hitpoints */
	player->upkeep->update |= PU_HP;
	player->upkeep->redraw |= PR_HP;

	msg("Current Life Rating is %d/100.", percent);
}